

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_RangeRowBoundedVarOptimalSolution_Test::
~SimplexTest_RangeRowBoundedVarOptimalSolution_Test
          (SimplexTest_RangeRowBoundedVarOptimalSolution_Test *this)

{
  void *in_RDI;
  
  ~SimplexTest_RangeRowBoundedVarOptimalSolution_Test
            ((SimplexTest_RangeRowBoundedVarOptimalSolution_Test *)0x1d14b8);
  operator_delete(in_RDI,0xc0);
  return;
}

Assistant:

TEST_F(SimplexTest, RangeRowBoundedVarOptimalSolution) {
  lp.add_column(ColType::Bounded, -4, 6, -5);
  lp.add_row(RowType::Range, -5, 5, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-25.0, z);
  EXPECT_EQ(DVector({5.0, 0.0}), x);
}